

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void address_space_unmap_mips
               (AddressSpace *as,void *buffer,hwaddr len,_Bool is_write,hwaddr access_len)

{
  uc_struct_conflict4 *uc;
  MemoryRegion *pMVar1;
  void *buf;
  ram_addr_t addr1;
  
  uc = (uc_struct_conflict4 *)as->uc;
  buf = (uc->bounce).buffer;
  if (buf == buffer) {
    if (is_write) {
      address_space_write_mips(as,(uc->bounce).addr,(MemTxAttrs)0x1,buf,access_len);
      buf = (as->uc->bounce).buffer;
    }
    qemu_vfree(buf);
    (as->uc->bounce).buffer = (void *)0x0;
  }
  else {
    pMVar1 = memory_region_from_host_mips(uc,buffer,&addr1);
    if (pMVar1 == (MemoryRegion *)0x0) {
      __assert_fail("mr != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x77d,
                    "void address_space_unmap_mips(AddressSpace *, void *, hwaddr, _Bool, hwaddr)");
    }
  }
  return;
}

Assistant:

void address_space_unmap(AddressSpace *as, void *buffer, hwaddr len,
                         bool is_write, hwaddr access_len)
{
    if (buffer != as->uc->bounce.buffer) {
        MemoryRegion *mr;
        ram_addr_t addr1;

        mr = memory_region_from_host(as->uc, buffer, &addr1);
        assert(mr != NULL);
        if (is_write) {
            invalidate_and_set_dirty(mr, addr1, access_len);
        }
        return;
    }
    if (is_write) {
        address_space_write(as, as->uc->bounce.addr, MEMTXATTRS_UNSPECIFIED,
                            as->uc->bounce.buffer, access_len);
    }
    qemu_vfree(as->uc->bounce.buffer);
    as->uc->bounce.buffer = NULL;
}